

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

double __thiscall
crnlib::vec<6U,_float>::normalize(vec<6U,_float> *this,vec<6U,_float> *pDefaultVec)

{
  double dVar1;
  uint local_24;
  double dStack_20;
  uint i;
  double n;
  vec<6U,_float> *pDefaultVec_local;
  vec<6U,_float> *this_local;
  
  dStack_20 = (double)(this->m_s[0] * this->m_s[0]);
  for (local_24 = 1; local_24 < 6; local_24 = local_24 + 1) {
    dStack_20 = (double)(this->m_s[local_24] * this->m_s[local_24]) + dStack_20;
  }
  if ((dStack_20 != 0.0) || (NAN(dStack_20))) {
    dVar1 = sqrt(dStack_20);
    operator*=(this,(float)(1.0 / dVar1));
  }
  else if (pDefaultVec != (vec<6U,_float> *)0x0) {
    operator=(this,pDefaultVec);
  }
  return dStack_20;
}

Assistant:

inline double normalize(const vec* pDefaultVec = nullptr) {
            double n = m_s[0] * m_s[0];
            for (uint i = 1; i < N; i++)
            {
                n += m_s[i] * m_s[i];
            }

            if (n != 0)
            {
                *this *= static_cast<T>((1.0f / sqrt(n)));
            }
            else if (pDefaultVec)
            {
                *this = *pDefaultVec;
            }
            return n;
        }